

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O0

void __thiscall
ninx::evaluator::DefaultEvaluator::evaluate_function
          (DefaultEvaluator *this,Block *target_object,FunctionDefinition *function,
          unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
          *body)

{
  bool bVar1;
  pointer pBVar2;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_38;
  undefined1 local_30 [8];
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  result;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  *body_local;
  FunctionDefinition *function_local;
  Block *target_object_local;
  DefaultEvaluator *this_local;
  
  result._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl =
       (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
        )(__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
          )body;
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::unique_ptr(&local_38,body);
  parser::element::FunctionDefinition::evaluate
            ((FunctionDefinition *)local_30,(Block *)function,
             (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
              *)target_object);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr(&local_38);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_30);
  if (bVar1) {
    pBVar2 = std::
             unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
             ::operator->((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                           *)local_30);
    (*(pBVar2->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[2])(pBVar2,this);
  }
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_30);
  return;
}

Assistant:

void ninx::evaluator::DefaultEvaluator::evaluate_function(ninx::parser::element::Block *target_object,
                                                          ninx::parser::element::FunctionDefinition *function,
                                                          std::unique_ptr<ninx::parser::element::Block> body) {
    // Evaluate the result. ( Used for builtin functions, otherwise it is a noop ).
    auto result {function->evaluate(target_object, std::move(body))};

    if (result) {
        result->accept(this);
    }
}